

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O2

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::CloneMap
          (DeserializationCloner<Js::StreamReader> *this,Src src,Dst dst)

{
  scaposition_t sVar1;
  JavascriptMap *this_00;
  Engine *pEVar2;
  int iVar3;
  Var local_48;
  Var value;
  Var key;
  int32 size;
  
  this_00 = VarTo<Js::JavascriptMap>(dst);
  StreamReader::Read<int>(this->m_reader,(int *)((long)&key + 4));
  iVar3 = 0;
  while( true ) {
    if (key._4_4_ <= iVar3) {
      return;
    }
    pEVar2 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
             ::GetEngine(&this->
                          super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                        );
    sVar1 = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (pEVar2,sVar1,&value);
    if (value == (Var)0x0) break;
    pEVar2 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
             ::GetEngine(&this->
                          super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                        );
    sVar1 = StreamReader::GetPosition(this->m_reader);
    SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
              (pEVar2,sVar1,&local_48);
    if (local_48 == (Var)0x0) break;
    JavascriptMap::Set(this_00,value,local_48);
    iVar3 = iVar3 + 1;
  }
  ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
}

Assistant:

void DeserializationCloner<Reader>::CloneMap(Src src, Dst dst)
    {
        JavascriptMap* map = VarTo<JavascriptMap>(dst);

        int32 size;
        m_reader->Read(&size);

        for (int i = 0; i < size; i++)
        {
            Var key;
            Var value;

            this->GetEngine()->Clone(m_reader->GetPosition(), &key);
            if (!key)
            {
                this->ThrowSCADataCorrupt();
            }

            this->GetEngine()->Clone(m_reader->GetPosition(), &value);
            if (!value)
            {
                this->ThrowSCADataCorrupt();
            }

            map->Set(key, value);
        }
    }